

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
SmallArray<VariableData_*,_128U>::~SmallArray(SmallArray<VariableData_*,_128U> *this)

{
  VariableData **ppVVar1;
  
  ppVVar1 = this->data;
  if (ppVVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppVVar1 != (VariableData **)0x0) {
        (*(code *)NULLC::dealloc)(ppVVar1);
      }
    }
    else if (ppVVar1 != (VariableData **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}